

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1Destroy(sqlite3_pcache *p)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  lVar1 = *(long *)p;
  if (*(int *)(p + 0x38) != 0) {
    pcache1TruncateUnsafe((PCache1 *)p,0);
  }
  iVar2 = *(int *)(lVar1 + 8) - *(int *)(p + 0x24);
  *(int *)(lVar1 + 8) = iVar2;
  iVar3 = *(int *)(lVar1 + 0xc) - *(int *)(p + 0x20);
  *(int *)(lVar1 + 0xc) = iVar3;
  *(int *)(lVar1 + 0x10) = (iVar2 - iVar3) + 10;
  pcache1EnforceMaxPage((PCache1 *)p);
  sqlite3_free(*(void **)(p + 0x50));
  sqlite3_free(*(void **)(p + 0x40));
  sqlite3_free(p);
  return;
}

Assistant:

static void pcache1Destroy(sqlite3_pcache *p){
  PCache1 *pCache = (PCache1 *)p;
  PGroup *pGroup = pCache->pGroup;
  assert( pCache->bPurgeable || (pCache->nMax==0 && pCache->nMin==0) );
  pcache1EnterMutex(pGroup);
  if( pCache->nPage ) pcache1TruncateUnsafe(pCache, 0);
  assert( pGroup->nMaxPage >= pCache->nMax );
  pGroup->nMaxPage -= pCache->nMax;
  assert( pGroup->nMinPage >= pCache->nMin );
  pGroup->nMinPage -= pCache->nMin;
  pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
  pcache1EnforceMaxPage(pCache);
  pcache1LeaveMutex(pGroup);
  sqlite3_free(pCache->pBulk);
  sqlite3_free(pCache->apHash);
  sqlite3_free(pCache);
}